

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Build_Map.cpp
# Opt level: O0

void __thiscall
Build_Map::Build_Map
          (Build_Map *this,vector<double,_std::allocator<double>_> *_Boundary,double _xy_res,
          double _z_res,double _margin)

{
  double dVar1;
  initializer_list<int> __l;
  reference pvVar2;
  vector<double,_std::allocator<double>_> *this_00;
  int local_5c;
  int local_58;
  int local_54;
  iterator local_50;
  undefined8 local_48;
  int local_3c;
  int local_38;
  int World_Z;
  int World_Y;
  int World_X;
  double _margin_local;
  double _z_res_local;
  double _xy_res_local;
  vector<double,_std::allocator<double>_> *_Boundary_local;
  Build_Map *this_local;
  
  this->_vptr_Build_Map = (_func_int **)&PTR__Build_Map_001c0120;
  this_00 = &this->Boundary;
  _World_Y = _margin;
  _margin_local = _z_res;
  _z_res_local = _xy_res;
  _xy_res_local = (double)_Boundary;
  _Boundary_local = (vector<double,_std::allocator<double>_> *)this;
  std::vector<double,_std::allocator<double>_>::vector(this_00,_Boundary);
  std::vector<int,_std::allocator<int>_>::vector(&this->World);
  this->xy_res = _z_res_local;
  this->z_res = _margin_local;
  this->margin = _World_Y;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,3);
  dVar1 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,0);
  World_Z = (int)((dVar1 - *pvVar2) / this->xy_res);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,4);
  dVar1 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,1);
  local_38 = (int)((dVar1 - *pvVar2) / this->xy_res);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,5);
  dVar1 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,2);
  local_54 = (int)((dVar1 - *pvVar2) / this->z_res);
  local_5c = World_Z;
  local_58 = local_38;
  local_50 = &local_5c;
  local_48 = 3;
  __l._M_len = 3;
  __l._M_array = local_50;
  local_3c = local_54;
  std::vector<int,_std::allocator<int>_>::operator=(&this->World,__l);
  return;
}

Assistant:

Build_Map::Build_Map(std::vector<double> _Boundary, double _xy_res,
                     double _z_res, double _margin)
    : Boundary(_Boundary),
      xy_res(_xy_res),
      z_res(_z_res),
      margin(_margin) {
  int World_X = (Boundary[3] - Boundary[0]) / xy_res;  ///< X Dimension
  int World_Y = (Boundary[4] - Boundary[1]) / xy_res;  ///< Y Dimension
  int World_Z = (Boundary[5] - Boundary[2]) / z_res;  ///< Z Dimension
  World = {World_X, World_Y, World_Z};
}